

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::DataPageHeader::DataPageHeader(DataPageHeader *this)

{
  *(undefined ***)this = &PTR__DataPageHeader_004a6be8;
  this->num_values = 0;
  this->encoding = PLAIN;
  this->definition_level_encoding = PLAIN;
  this->repetition_level_encoding = PLAIN;
  *(undefined ***)&this->statistics = &PTR__Statistics_004a6360;
  (this->statistics).max._M_dataplus._M_p = (pointer)&(this->statistics).max.field_2;
  (this->statistics).max._M_string_length = 0;
  (this->statistics).max.field_2._M_local_buf[0] = '\0';
  (this->statistics).min._M_dataplus._M_p = (pointer)&(this->statistics).min.field_2;
  (this->statistics).min._M_string_length = 0;
  (this->statistics).min.field_2._M_local_buf[0] = '\0';
  (this->statistics).null_count = 0;
  (this->statistics).distinct_count = 0;
  (this->statistics).max_value._M_dataplus._M_p = (pointer)&(this->statistics).max_value.field_2;
  (this->statistics).max_value._M_string_length = 0;
  (this->statistics).max_value.field_2._M_local_buf[0] = '\0';
  (this->statistics).min_value._M_dataplus._M_p = (pointer)&(this->statistics).min_value.field_2;
  (this->statistics).min_value._M_string_length = 0;
  (this->statistics).min_value.field_2._M_local_buf[0] = '\0';
  (this->statistics).is_max_value_exact = false;
  (this->statistics).is_min_value_exact = false;
  (this->statistics).__isset = (_Statistics__isset)0x0;
  this->__isset = (_DataPageHeader__isset)((byte)this->__isset & 0xfe);
  return;
}

Assistant:

DataPageHeader::DataPageHeader() noexcept
   : num_values(0),
     encoding(static_cast<Encoding::type>(0)),
     definition_level_encoding(static_cast<Encoding::type>(0)),
     repetition_level_encoding(static_cast<Encoding::type>(0)) {
}